

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapEditor.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *__s;
  allocator<char> local_129;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  _InputArray local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Mat src;
  
  local_b0 = 0x384000004b0;
  cv::Mat::Mat(&src,&local_b0,0x10);
  local_108.field_2._M_allocated_capacity = 0;
  local_108._M_dataplus._M_p._0_4_ = 0x3010000;
  local_a8 = 0;
  uStack_a0 = 0x384000004b0;
  local_108._M_string_length = (size_type)&src;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&name);
  name._M_dataplus._M_p = (pointer)0x4059000000000000;
  name._M_string_length = 0x4059000000000000;
  name.field_2._M_allocated_capacity = 0x4059000000000000;
  name.field_2._8_8_ = 0;
  cv::rectangle(&local_108,&local_a8,&name,0xffffffffffffffff,8,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"disp",(allocator<char> *)&local_108);
  cv::namedWindow((string *)&name,1);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"disp",(allocator<char> *)&local_108);
  cv::setMouseCallback((string *)&name,on_mouse,(void *)0x0);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"test",(allocator<char> *)&local_108);
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,argv[1],(allocator<char> *)&local_e8);
    std::__cxx11::string::operator=((string *)&name,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  while( true ) {
    while( true ) {
      mapDraw(&obsts,&obstacle,&src);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"disp",&local_129);
      local_e8.sz.width = 0;
      local_e8.sz.height = 0;
      local_e8.flags = 0x1010000;
      local_e8.obj = &src;
      cv::imshow((string *)&local_108,&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      cVar1 = cv::waitKey(10);
      if (cVar1 != 'e') break;
      if (0x10 < (ulong)((long)obstacle.
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)obstacle.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        std::
        vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
        ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&>
                  ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                    *)&obsts,&obstacle);
        if (obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        puts("One obstacle is added.");
      }
    }
    if (cVar1 == '\x1b') break;
    if (cVar1 == 's') {
      if (0x10 < (ulong)((long)obstacle.
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)obstacle.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        std::
        vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
        ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&>
                  ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                    *)&obsts,&obstacle);
        if (obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               obstacle.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
      }
      std::operator+(&local_108,"../maps/",&name);
      std::operator+(&local_d0,&local_108,".txt");
      mapSave(&obsts,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_108);
      __s = "Map saved.";
LAB_0010a999:
      puts(__s);
      std::__cxx11::string::~string((string *)&name);
      cv::Mat::~Mat(&src);
      return 0;
    }
  }
  __s = "Exiting directly, map not saved.";
  goto LAB_0010a999;
}

Assistant:

int main(int argc, char** argv) {
    const cv::Rect rect(0, 0, 1200, 900);
    cv::Mat src(cv::Size(1200, 900), CV_8UC3);
    cv::rectangle(src, rect, cv::Scalar(100, 100, 100), -1);
    cv::namedWindow("disp", cv::WINDOW_AUTOSIZE);
    cv::setMouseCallback("disp", on_mouse, NULL);
    std::string name = "test";
    if (argc >= 2) {
        name = std::string(argv[1]);
    }
    while (true) {
        mapDraw(obsts, obstacle, src);
        cv::imshow("disp", src);
        char key = cv::waitKey(10);
        if (key == 27) {
            printf("Exiting directly, map not saved.\n");
            break;
        } else if (key == 'e') {
            if (obstacle.size() < 3) continue;
            obsts.emplace_back(obstacle);
            obstacle.clear();
            printf("One obstacle is added.\n");
        } else if (key == 's') {
            if (obstacle.size() >= 3) {
                obsts.emplace_back(obstacle);
                obstacle.clear();
            }
            mapSave(obsts, "../maps/" + name + ".txt");
            printf("Map saved.\n");
            break;
        }
    }
    return 0;
}